

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPath.cpp
# Opt level: O2

void __thiscall CppUnit::TestPath::removeTest(TestPath *this,int index)

{
  _Self local_98;
  _Self local_78;
  const_iterator local_58;
  iterator local_38;
  
  checkIndexValid(this,index);
  local_98._M_cur =
       (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
       super__Deque_impl_data._M_start._M_cur;
  local_98._M_first =
       (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
       super__Deque_impl_data._M_start._M_first;
  local_98._M_last =
       (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
       super__Deque_impl_data._M_start._M_last;
  local_98._M_node =
       (this->m_tests).super__Deque_base<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>._M_impl.
       super__Deque_impl_data._M_start._M_node;
  std::operator+(&local_78,&local_98,(long)index);
  local_58._M_cur = local_78._M_cur;
  local_58._M_first = local_78._M_first;
  local_58._M_last = local_78._M_last;
  local_58._M_node = local_78._M_node;
  std::deque<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>::erase
            (&local_38,&this->m_tests,&local_58);
  return;
}

Assistant:

void 
TestPath::removeTest( int index )
{
  checkIndexValid( index );
  m_tests.erase( m_tests.begin() + index );
}